

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::begin_document
          (basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          json_visitor *visitor,error_code *ec)

{
  value_type *__src;
  bson_errc __e;
  ulong uVar1;
  size_t __n;
  uint8_t buf [4];
  size_t n;
  parse_mode local_38;
  type_conflict4 length;
  
  if (*(int *)((this->options_)._vptr_bson_decode_options[-3] + 8 +
              (long)&(this->options_)._vptr_bson_decode_options) <
      (int)(((long)(this->state_stack_).
                   super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->state_stack_).
                  super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
    __e = max_nesting_depth_exceeded;
  }
  else {
    __src = (this->source_).current_;
    uVar1 = (long)(this->source_).end_ - (long)__src;
    __n = 4;
    if (uVar1 < 4) {
      __n = uVar1;
    }
    memcpy(buf,__src,__n);
    (this->source_).current_ = __src + __n;
    n = __n;
    if (3 < uVar1) {
      length._0_1_ = buf[0];
      length._1_1_ = buf[1];
      length._2_1_ = buf[2];
      length._3_1_ = buf[3];
      (*visitor->_vptr_basic_json_visitor[3])(visitor,0,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      local_38 = document;
      std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
      emplace_back<jsoncons::bson::parse_mode,int&,unsigned_long&>
                ((vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>> *)
                 &this->state_stack_,&local_38,&length,&n);
      return;
    }
    __e = unexpected_eof;
  }
  std::error_code::operator=(ec,__e);
  this->more_ = false;
  return;
}

Assistant:

void begin_document(json_visitor& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(static_cast<int>(state_stack_.size()) > options_.max_nesting_depth()))
        {
            ec = bson_errc::max_nesting_depth_exceeded;
            more_ = false;
            return;
        } 

        uint8_t buf[sizeof(int32_t)]; 
        std::size_t n = source_.read(buf, sizeof(int32_t));
        if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }

        auto length = binary::little_to_native<int32_t>(buf, sizeof(buf));

        visitor.begin_object(semantic_tag::none, *this, ec);
        more_ = !cursor_mode_;
        state_stack_.emplace_back(parse_mode::document,length,n);
    }